

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O1

bool equal<wchar_t,wchar_t>
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s1,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s2)

{
  wchar_t *pwVar1;
  int iVar2;
  bool bVar3;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80;
  size_t local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  size_t local_58;
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"UTF-8","");
  pwVar1 = (s1->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_80,pwVar1,(string *)(pwVar1 + s1->_M_string_length),
             (method_type)(string *)local_40);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"UTF-8","");
  pwVar1 = (s2->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_60,pwVar1,(string *)(pwVar1 + s2->_M_string_length),
             (method_type)local_a0);
  if (local_78 == local_58) {
    if (local_78 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_80,local_60,local_78);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return bVar3;
}

Assistant:

bool equal(std::basic_string<C1> const &s1,std::basic_string<C2> const &s2)
{
    return booster::locale::conv::from_utf(s1,"UTF-8") == booster::locale::conv::from_utf(s2,"UTF-8");
}